

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

size_t nni_base64_decode(char *in,size_t in_len,uint8_t *out,size_t out_len)

{
  uint uVar1;
  ushort **ppuVar2;
  size_t sVar3;
  byte local_148 [8];
  uint8_t decode [256];
  size_t io;
  uint uStack_38;
  uint8_t ch;
  uint32_t v;
  uint rem;
  uint ii;
  size_t out_len_local;
  uint8_t *out_local;
  size_t in_len_local;
  char *in_local;
  
  memcpy(local_148,&DAT_0015a660,0x100);
  decode[0xf8] = '\0';
  decode[0xf9] = '\0';
  decode[0xfa] = '\0';
  decode[0xfb] = '\0';
  decode[0xfc] = '\0';
  decode[0xfd] = '\0';
  decode[0xfe] = '\0';
  decode[0xff] = '\0';
  io._4_4_ = 0;
  uStack_38 = 0;
  for (v = 0; v < in_len; v = v + 1) {
    ppuVar2 = __ctype_b_loc();
    uVar1 = uStack_38;
    if (((*ppuVar2)[(int)in[v]] & 0x2000) == 0) {
      if ((in[v] == '=') || (local_148[(int)in[v]] == 0xff)) break;
      io._4_4_ = io._4_4_ << 6 | (uint)local_148[(int)in[v]];
      uVar1 = uStack_38 + 6;
      if (7 < uStack_38 + 6) {
        if (out_len <= (ulong)decode._248_8_) {
          return 0xffffffffffffffff;
        }
        out[decode._248_8_] = (uint8_t)(io._4_4_ >> ((byte)(uStack_38 - 2) & 0x1f));
        decode._248_8_ = decode._248_8_ + 1;
        uVar1 = uStack_38 - 2;
      }
    }
    uStack_38 = uVar1;
  }
  if (7 < uStack_38) {
    if (out_len <= (ulong)decode._248_8_) {
      return 0xffffffffffffffff;
    }
    out[decode._248_8_] = (uint8_t)(io._4_4_ >> ((char)uStack_38 - 8U & 0x1f));
    decode._248_8_ = decode._248_8_ + 1;
  }
  sVar3._0_1_ = decode[0xf8];
  sVar3._1_1_ = decode[0xf9];
  sVar3._2_1_ = decode[0xfa];
  sVar3._3_1_ = decode[0xfb];
  sVar3._4_1_ = decode[0xfc];
  sVar3._5_1_ = decode[0xfd];
  sVar3._6_1_ = decode[0xfe];
  sVar3._7_1_ = decode[0xff];
  return sVar3;
}

Assistant:

size_t
nni_base64_decode(const char *in, size_t in_len, uint8_t *out, size_t out_len)
{
	unsigned ii;
	unsigned rem;
	uint32_t v;
	uint8_t  ch;
	size_t   io;

	// Unrolled lookup of ASCII code points.
	// 0xFF represents a non-base64 valid character.
	const uint8_t decode[256] = { 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0x3E, 0xFF, 0xFF, 0xFF,
		0x3F, 0x34, 0x35, 0x36, 0x37, 0x38, 0x39, 0x3A, 0x3B, 0x3C,
		0x3D, 0xFF, 0xFF, 0xFF, 0x3E, 0xFF, 0xFF, 0xFF, 0x00, 0x01,
		0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 0x08, 0x09, 0x0A, 0x0B,
		0x0C, 0x0D, 0x0E, 0x0F, 0x10, 0x11, 0x12, 0x13, 0x14, 0x15,
		0x16, 0x17, 0x18, 0x19, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0x1A, 0x1B, 0x1C, 0x1D, 0x1E, 0x1F, 0x20, 0x21, 0x22, 0x23,
		0x24, 0x25, 0x26, 0x27, 0x28, 0x29, 0x2A, 0x2B, 0x2C, 0x2D,
		0x2E, 0x2F, 0x30, 0x31, 0x32, 0x33, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };

	for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
		if (isspace(in[ii])) {
			continue;
		}

		if (in[ii] == '=') {
			break;
		}

		ch = decode[(int) (in[ii])];

		// Discard invalid characters as per RFC 2045.
		if (ch == 0xFF) {
			break;
		}

		v = (v << 6u) | ch;
		rem += 6;

		if (rem >= 8) {
			rem -= 8;
			if (io >= out_len)
				return (-1);
			out[io++] = (v >> rem) & 255u;
		}
	}
	if (rem >= 8) {
		rem -= 8;
		if (io >= out_len)
			return (-1);
		out[io++] = (v >> rem) & 255u;
	}
	return (io);
}